

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_value_blob(sqlite3_value *pVal)

{
  sqlite3_value *local_28;
  Mem *p;
  sqlite3_value *pVal_local;
  
  if ((pVal->flags & 0x12) == 0) {
    pVal_local = (sqlite3_value *)sqlite3_value_text(pVal);
  }
  else {
    sqlite3VdbeMemExpandBlob(pVal);
    pVal->flags = pVal->flags & 0xfffd;
    pVal->flags = pVal->flags | 0x10;
    if (pVal->n == 0) {
      local_28 = (sqlite3_value *)0x0;
    }
    else {
      local_28 = (sqlite3_value *)pVal->z;
    }
    pVal_local = local_28;
  }
  return pVal_local;
}

Assistant:

SQLITE_API const void *sqlite3_value_blob(sqlite3_value *pVal){
  Mem *p = (Mem*)pVal;
  if( p->flags & (MEM_Blob|MEM_Str) ){
    sqlite3VdbeMemExpandBlob(p);
    p->flags &= ~MEM_Str;
    p->flags |= MEM_Blob;
    return p->n ? p->z : 0;
  }else{
    return sqlite3_value_text(pVal);
  }
}